

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O2

int profitCB(void *mystate,void *ud)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  uint index;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  bool_t bVar7;
  uint uVar8;
  prf_node_t *ppVar9;
  uint32_t *puVar10;
  undefined8 *item;
  void *pvVar11;
  int *piVar12;
  size_t sVar13;
  char *__dest;
  matrix4x4_f32_t *m;
  long lVar14;
  void **ppvVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  short sVar20;
  float32_t fVar21;
  float local_118;
  undefined8 local_114;
  uint local_10c;
  prf_vertex_s vertex;
  
  ppVar9 = *(prf_node_t **)((long)mystate + 8);
  uVar4 = ppVar9->opcode;
  iVar5 = 2;
  iVar6 = iVar5;
  if (uVar4 != 0x3e) {
    iVar6 = 1;
    if (uVar4 == 0x3d) {
      ppVar9 = prf_state_get_instance_from_node((prf_state_t *)mystate,ppVar9);
      if (ppVar9 == (prf_node_t *)0x0) {
        array_count(*(void **)((long)mystate + 0x40));
      }
      else {
        uVar8 = array_count(ppVar9->children);
        prf_state_push((prf_state_t *)mystate);
        uVar16 = 0;
        uVar18 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar18 = uVar16;
        }
        for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
          prf_model_traverse_io_(ppVar9->children[uVar16],(prf_state_t *)mystate);
        }
        prf_state_pop((prf_state_t *)mystate);
      }
    }
    else if ((uVar4 == 2) && ((ppVar9->data[0xf] & 0x60) != 0)) {
      prf_state_push((prf_state_t *)mystate);
      prf_model_traverse_io_
                (*(prf_node_t **)(*(long *)(*(long *)((long)mystate + 8) + 0x10) + 8),
                 (prf_state_t *)mystate);
      prf_state_pop((prf_state_t *)mystate);
      iVar6 = iVar5;
    }
    else {
      prf_nodeinfo_get(uVar4);
      ppVar9 = *(prf_node_t **)((long)mystate + 8);
      uVar4 = ppVar9->opcode;
      if (uVar4 == 5) {
        vertexarray = (float *)_array_set_count(vertexarray,0);
        texcoordarray = (float *)_array_set_count(texcoordarray,0);
        colorarray = (int *)_array_set_count(colorarray,0);
        lVar17 = *(long *)(*(long *)((long)mystate + 8) + 8);
        iVar6 = iVar5;
        if ((*(uint *)(lVar17 + 0x28) >> 0x1a & 1) == 0) {
          profitCB_is_in_face = 1;
          profitCB_color_per_vertex = (*(byte *)(lVar17 + 0x2c) | 2) == 3;
          if ((*(uint *)(lVar17 + 0x28) & 0x50000000) == 0) {
            if (ofversion < 0x5dc) {
              uVar8 = (uint)*(ushort *)(lVar17 + 0x10);
            }
            else {
              uVar8 = *(uint *)(lVar17 + 0x40);
            }
            uVar8 = my_palette_lookup((prf_state_t *)mystate,uVar8);
          }
          else {
            uVar8 = *(uint *)(lVar17 + 0x34);
          }
          sVar20 = *(short *)(lVar17 + 0x18);
          sVar2 = *(short *)(lVar17 + 0x1a);
          iVar19 = (uint)*(ushort *)((long)mystate + 0x74) * (uint)*(ushort *)(lVar17 + 0x24);
          bVar1 = *(byte *)(lVar17 + 0x2c);
          local_118 = (float)uVar8;
          local_114 = CONCAT44((float)*(ushort *)((long)mystate + 0x78) * 65536.0 * 256.0 +
                               (float)bVar1 * 65536.0 + (float)(iVar19 >> 0x10),
                               (float)(int)sVar2 * 65536.0 + (float)(int)sVar20);
          iVar5 = bsp_add_point(materialLookup,&local_118);
          profitCB::current_index = iVar5;
          iVar6 = array_count(facesets);
          if (iVar6 <= iVar5) {
            item = (undefined8 *)malloc(0xa0);
            pvVar11 = bsp_create(3);
            *item = pvVar11;
            pvVar11 = bsp_create(2);
            item[1] = pvVar11;
            local_10c = (int)sVar20;
            piVar12 = array_create_int(4);
            item[3] = piVar12;
            piVar12 = array_create_int(4);
            item[4] = piVar12;
            piVar12 = array_create_int(4);
            index = local_10c;
            item[5] = piVar12;
            piVar12 = array_create_int(4);
            item[2] = piVar12;
            pvVar11 = bsp_create(3);
            item[6] = pvVar11;
            *(uint *)(item + 7) = uVar8;
            sVar20 = (short)index;
            *(short *)((long)item + 0x3c) = sVar20;
            item[8] = 0;
            *(uint *)((long)item + 0x9c) = (uint)*(ushort *)((long)mystate + 0x78);
            if (((-1 < sVar20) &&
                (bVar7 = prf_state_texture_lookup
                                   ((prf_state_t *)mystate,index,(prf_texture_t *)&vertex),
                bVar7 != 0)) && (sVar13 = strlen((char *)&vertex), sVar13 != 0)) {
              __dest = (char *)malloc(sVar13 + 1);
              item[8] = __dest;
              strcpy(__dest,(char *)&vertex);
            }
            *(short *)(item + 9) = sVar2;
            *(short *)((long)item + 0x4a) = (short)((uint)iVar19 >> 0x10);
            *(ushort *)((long)item + 0x4c) = (ushort)bVar1;
            bVar7 = prf_state_material_lookup
                              ((prf_state_t *)mystate,(int)sVar2,(prf_material_t *)(item + 10));
            if (bVar7 == 0) {
              *(undefined8 *)((long)item + 0x74) = 0x3f8000003f800000;
              *(undefined8 *)((long)item + 0x7c) = 0x3f8000003f800000;
              *(undefined8 *)((long)item + 100) = 0x3e4ccccd3e4ccccd;
              *(undefined8 *)((long)item + 0x6c) = 0x3f8000003e4ccccd;
              *(undefined8 *)((long)item + 0x84) = 0x3f800000;
              *(undefined8 *)((long)item + 0x8c) = 0;
              *(undefined8 *)((long)item + 0x94) = 0x3f80000041cccccd;
            }
            facesets = _array_append_ptr(facesets,item);
          }
          pvVar11 = *(void **)(*(long *)((long)mystate + 8) + 0x10);
          if (pvVar11 != (void *)0x0) {
            uVar8 = array_count(pvVar11);
            prf_state_push((prf_state_t *)mystate);
            if ((int)uVar8 < 1) {
              uVar8 = 0;
            }
            bVar3 = false;
            for (uVar18 = 0; uVar8 != uVar18; uVar18 = uVar18 + 1) {
              ppVar9 = *(prf_node_t **)((long)pvVar11 + uVar18 * 8);
              uVar4 = ppVar9->opcode;
              if (uVar4 == 0x13) {
                bVar3 = true;
              }
              if (!bVar3) {
                prf_model_traverse_io_(ppVar9,(prf_state_t *)mystate);
                uVar4 = **(uint16_t **)((long)pvVar11 + uVar18 * 8);
              }
              if (uVar4 == 0x14) {
                bVar3 = false;
              }
            }
            prf_state_pop((prf_state_t *)mystate);
            prf_state_push((prf_state_t *)mystate);
            bVar3 = false;
            for (uVar18 = 0; uVar8 != uVar18; uVar18 = uVar18 + 1) {
              ppVar9 = *(prf_node_t **)((long)pvVar11 + uVar18 * 8);
              uVar4 = ppVar9->opcode;
              if (uVar4 == 0x13) {
                bVar3 = true;
              }
              if (bVar3) {
                prf_model_traverse_io_(ppVar9,(prf_state_t *)mystate);
                uVar4 = **(uint16_t **)((long)pvVar11 + uVar18 * 8);
              }
              if (uVar4 == 0x14) {
                bVar3 = false;
              }
            }
            prf_state_pop((prf_state_t *)mystate);
          }
          iVar6 = 2;
        }
      }
      else if (uVar4 == 0x48 && (~profitCB_is_in_face & 1) == 0) {
        uVar8 = prf_vertex_list_get_count(ppVar9);
        puVar10 = prf_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
        uVar16 = 0;
        uVar18 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar18 = uVar16;
        }
        for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
          prf_model_vertex_palette_lookup(currmodel,puVar10[uVar16],&vertex);
          vertexarray = _array_append_float(vertexarray,(float)(double)vertex.x);
          vertexarray = _array_append_float(vertexarray,(float)(double)vertex.y);
          vertexarray = _array_append_float(vertexarray,(float)(double)vertex.z);
          if (vertex.has_texture == 0) {
            texcoordarray = _array_append_float(texcoordarray,0.0);
            fVar21 = 0.0;
          }
          else {
            texcoordarray = _array_append_float(texcoordarray,(float)vertex.texture[0]);
            fVar21 = vertex.texture[1];
          }
          texcoordarray = _array_append_float(texcoordarray,(float)fVar21);
          piVar12 = colorarray;
          if (profitCB_color_per_vertex == '\x01') {
            if ((vertex.flags >> 0xd & 1) == 0) {
              uVar8 = vertex.packed_color;
              if ((vertex.flags >> 0xc & 1) == 0) {
                uVar8 = my_palette_lookup((prf_state_t *)mystate,(uint)vertex.color_name_index);
              }
            }
            else {
              uVar8 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
            }
            colorarray = _array_append_int(piVar12,uVar8);
          }
        }
      }
      else if ((profitCB_is_in_face & 1) != 0) {
        if (uVar4 == 0x59) {
          iVar5 = prf_morph_vertex_list_get_count(ppVar9);
          puVar10 = prf_morph_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
          for (lVar17 = 0; lVar17 < iVar5 * 2; lVar17 = lVar17 + 2) {
            prf_model_vertex_palette_lookup(currmodel,puVar10[lVar17],&vertex);
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.x);
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.y);
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.z);
            if (vertex.has_texture == 0) {
              texcoordarray = _array_append_float(texcoordarray,0.0);
              fVar21 = 0.0;
            }
            else {
              texcoordarray = _array_append_float(texcoordarray,(float)vertex.texture[0]);
              fVar21 = vertex.texture[1];
            }
            texcoordarray = _array_append_float(texcoordarray,(float)fVar21);
            piVar12 = colorarray;
            if (profitCB_color_per_vertex == '\x01') {
              if ((vertex.flags >> 0xd & 1) == 0) {
                uVar8 = vertex.packed_color;
                if ((vertex.flags >> 0xc & 1) == 0) {
                  uVar8 = my_palette_lookup((prf_state_t *)mystate,(uint)vertex.color_name_index);
                }
              }
              else {
                uVar8 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
              }
              colorarray = _array_append_int(piVar12,uVar8);
            }
          }
        }
        else {
          bVar7 = prf_vertex_lookup(ppVar9,&vertex);
          if (bVar7 == 0) {
            if ((profitCB_is_in_face == 1) && (**(short **)((long)mystate + 8) == 0xb)) {
              profitCB_is_in_face = 0;
              m = prf_state_get_matrix((prf_state_t *)mystate);
              iVar5 = array_count(vertexarray);
              if (iVar5 != 3) {
                iVar5 = array_count(vertexarray);
                if (iVar5 == 6) {
                  local_118 = *vertexarray;
                  local_114 = *(undefined8 *)(vertexarray + 1);
                  mult_matrix_vec((float *)m,&local_118);
                  piVar12 = *(int **)((long)facesets[profitCB::current_index] + 0x20);
                  iVar5 = bsp_add_point(*(void **)((long)facesets[profitCB::current_index] + 0x30),
                                        &local_118);
                  piVar12 = _array_append_int(piVar12,iVar5);
                  ppvVar15 = facesets;
                  lVar17 = (long)profitCB::current_index;
                  *(int **)((long)facesets[lVar17] + 0x20) = piVar12;
                  local_118 = vertexarray[3];
                  local_114 = *(undefined8 *)(vertexarray + 4);
                  mult_matrix_vec((float *)m,&local_118);
                  piVar12 = *(int **)((long)ppvVar15[lVar17] + 0x20);
                  iVar5 = bsp_add_point(*(void **)((long)ppvVar15[lVar17] + 0x30),&local_118);
                  piVar12 = _array_append_int(piVar12,iVar5);
                  ppvVar15 = facesets;
                  lVar17 = (long)profitCB::current_index;
                  *(int **)((long)facesets[lVar17] + 0x20) = piVar12;
                  piVar12 = _array_append_int(*(int **)((long)ppvVar15[lVar17] + 0x20),-1);
                  ppvVar15 = facesets;
                  lVar17 = (long)profitCB::current_index;
                  *(int **)((long)facesets[lVar17] + 0x20) = piVar12;
                  if (profitCB_color_per_vertex == '\x01') {
                    packed_to_vec(*colorarray,&local_118);
                    piVar12 = *(int **)((long)ppvVar15[lVar17] + 0x10);
                    iVar5 = bsp_add_point(*ppvVar15[lVar17],&local_118);
                    piVar12 = _array_append_int(piVar12,iVar5);
                    ppvVar15 = facesets;
                    lVar17 = (long)profitCB::current_index;
                    *(int **)((long)facesets[lVar17] + 0x10) = piVar12;
                    packed_to_vec(colorarray[1],&local_118);
                    piVar12 = *(int **)((long)ppvVar15[lVar17] + 0x10);
                    iVar5 = bsp_add_point(*ppvVar15[lVar17],&local_118);
                    piVar12 = _array_append_int(piVar12,iVar5);
                    ppvVar15 = facesets;
                    lVar17 = (long)profitCB::current_index;
                    *(int **)((long)facesets[lVar17] + 0x10) = piVar12;
                    piVar12 = _array_append_int(*(int **)((long)ppvVar15[lVar17] + 0x10),-1);
                    *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar12;
                  }
                }
                else {
                  iVar5 = array_count(vertexarray);
                  if (8 < iVar5) {
                    sVar20 = *(short *)((long)facesets[profitCB::current_index] + 0x3c);
                    iVar5 = array_count(vertexarray);
                    uVar16 = 0;
                    uVar18 = (long)iVar5 / 3 & 0xffffffff;
                    if ((int)((long)iVar5 / 3) < 1) {
                      uVar18 = uVar16;
                    }
                    lVar17 = 8;
                    for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                      local_118 = *(float *)((long)vertexarray + lVar17 + -8);
                      local_114 = CONCAT44(*(undefined4 *)((long)vertexarray + lVar17),
                                           *(undefined4 *)((long)vertexarray + lVar17 + -4));
                      mult_matrix_vec((float *)m,&local_118);
                      piVar12 = *(int **)((long)facesets[profitCB::current_index] + 0x18);
                      iVar5 = bsp_add_point(*(void **)((long)facesets[profitCB::current_index] +
                                                      0x30),&local_118);
                      piVar12 = _array_append_int(piVar12,iVar5);
                      ppvVar15 = facesets;
                      iVar5 = profitCB::current_index;
                      lVar14 = (long)profitCB::current_index;
                      *(int **)((long)facesets[lVar14] + 0x18) = piVar12;
                      if (-1 < sVar20) {
                        local_118 = texcoordarray[uVar16 * 2];
                        local_114 = CONCAT44(texcoordarray[uVar16 * 2 + 2],
                                             texcoordarray[uVar16 * 2 + 1]);
                        piVar12 = *(int **)((long)ppvVar15[lVar14] + 0x28);
                        iVar5 = bsp_add_point(*(void **)((long)ppvVar15[lVar14] + 8),&local_118);
                        piVar12 = _array_append_int(piVar12,iVar5);
                        ppvVar15 = facesets;
                        iVar5 = profitCB::current_index;
                        *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar12;
                      }
                      if (profitCB_color_per_vertex == '\x01') {
                        packed_to_vec(colorarray[uVar16],&local_118);
                        piVar12 = *(int **)((long)ppvVar15[iVar5] + 0x10);
                        iVar5 = bsp_add_point(*ppvVar15[iVar5],&local_118);
                        piVar12 = _array_append_int(piVar12,iVar5);
                        *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar12;
                      }
                      lVar17 = lVar17 + 0xc;
                    }
                    piVar12 = _array_append_int(*(int **)((long)facesets[profitCB::current_index] +
                                                         0x18),-1);
                    ppvVar15 = facesets;
                    iVar5 = profitCB::current_index;
                    lVar17 = (long)profitCB::current_index;
                    *(int **)((long)facesets[lVar17] + 0x18) = piVar12;
                    if (-1 < sVar20) {
                      piVar12 = _array_append_int(*(int **)((long)ppvVar15[lVar17] + 0x28),-1);
                      ppvVar15 = facesets;
                      iVar5 = profitCB::current_index;
                      *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar12;
                    }
                    iVar6 = 1;
                    if (profitCB_color_per_vertex == '\x01') {
                      piVar12 = _array_append_int(*(int **)((long)ppvVar15[iVar5] + 0x10),-1);
                      *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar12;
                    }
                  }
                }
              }
            }
          }
          else {
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.x);
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.y);
            vertexarray = _array_append_float(vertexarray,(float)(double)vertex.z);
            texcoordarray = _array_append_float(texcoordarray,0.0);
            texcoordarray = _array_append_float(texcoordarray,0.0);
            piVar12 = colorarray;
            if (profitCB_color_per_vertex == '\x01') {
              if ((vertex.flags >> 0xd & 1) == 0) {
                if ((vertex.flags >> 0xc & 1) == 0) {
                  vertex.packed_color =
                       my_palette_lookup((prf_state_t *)mystate,(uint)vertex.color_name_index);
                }
              }
              else {
                vertex.packed_color = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
              }
              colorarray = _array_append_int(piVar12,vertex.packed_color);
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int
profitCB(void *mystate, void *ud)
{
  static int is_in_face = 0;
  static int current_index = -1;
  static int color_per_vertex = 0;
  prf_nodeinfo_t *info;
  int i,n;
  float tmp[3];
  prf_node_t **children;
  struct prf_vertex_s vertex;

  prf_state_t * state = (prf_state_t *)mystate;

  if (state->node->opcode == GROUP_OPCODE) {
    struct prf_group_data *data = (struct prf_group_data*) state->node->data;
    if (data->flags & PRF_GROUP_FLAG_ANIMATION) {
      assert(state->node->children && array_count(state->node->children) > 2);
      prf_state_push(state);
      prf_model_traverse_io_(state->node->children[1], state);
      prf_state_pop(state);
      return PRF_TRAV_SIBLING;
    }
  }
  else if (state->node->opcode == DEF_OPCODE) {
    return PRF_TRAV_SIBLING;
  }
  else if (state->node->opcode == REF_OPCODE) {
    prf_node_t *node = prf_state_get_instance_from_node(state, state->node);
    if (node) {
      int i, n = array_count(node->children);
      prf_state_push(state);
      for (i = 0; i < n; i++) {
	prf_model_traverse_io_(node->children[i], state);
      }
      prf_state_pop(state);
    }
    else {
      int n = array_count(state->instances);
    }
    assert(node);
    return PRF_TRAV_CONTINUE;
  }

  info = prf_nodeinfo_get(state->node->opcode);

  if (state->node->opcode == FACE_OPCODE) {
    struct prf_face_data *face;
    unsigned int packed_color;
    unsigned short lightmode;
    int idx;

    vertexarray=(float *)_array_set_count(vertexarray, 0);
    texcoordarray=(float *)_array_set_count(texcoordarray, 0);
    colorarray=(int *)_array_set_count(colorarray, 0);

    face = (struct prf_face_data*) state->node->data;

    if (!(face->flags & PRF_FACE_FLAGS_HIDDEN)) {
      short texture_pattern_index;
      short material_index;
      unsigned short transparency;
      is_in_face = 1;
      color_per_vertex = 0;
      if (face->light_mode == 1 || face->light_mode == 3) {
        color_per_vertex = 1;
      }

      packed_color = face->color_name_index;

      if (face->flags & 0x50000000) {
        packed_color = face->packed_color_primary;
      }
      else {
        if (ofversion < 1500) {
          packed_color = my_palette_lookup(state, face->color_name_index);
        }
        else {
          packed_color = my_palette_lookup(state, face->primary_color_index);
        }
      }
      texture_pattern_index = face->texture_pattern_index;
      material_index = face->material_index;

      transparency = (unsigned short)
        (((int32_t)(face->transparency) *
          (int32_t)(state->object_transparency)) >> 16);

      lightmode = face->light_mode;

      tmp[0] = (float) packed_color;
      tmp[1] = (float) texture_pattern_index +
        (float) material_index * 65536.0f;
      tmp[2] = (float) transparency +
        (float) lightmode * 65536.0f +
        (float) state->subface_level * 65536.0f * 256.0f;

      idx = bsp_add_point(materialLookup, tmp);
      current_index = idx;

      if (idx >= array_count(facesets)) {
        faceset *data = faceset_create();

        data->packed_color = packed_color;
        data->texture_pattern_index = texture_pattern_index;
        data->texture_pattern_filename = NULL;
        data->subface_level = state->subface_level;

        if (texture_pattern_index >= 0) {
          struct prf_texture_s tex;

          if (prf_state_texture_lookup(state, texture_pattern_index, &tex)) {

            if (strlen(tex.filename)) {
              data->texture_pattern_filename =
                (char *)malloc(strlen(tex.filename)+1);
              strcpy(data->texture_pattern_filename, tex.filename);
            }
          }
        }
         data->material_index = material_index;
         data->transparency = transparency;
         data->lightmode = lightmode;

         if (prf_state_material_lookup(state, material_index,
                                       &data->material)) {
             // FIXME: implement proper action
         }
         else {
           set_default_material(&data->material);
         }

         array_append_ptr(facesets, data);
      }

      children = state->node->children;
      if (children) {
        int insub = 0;
        n = array_count(children);

        prf_state_push(state);
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (!insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);

        prf_state_push(state);
        insub = 0;
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);
      }
    }
    return PRF_TRAV_SIBLING; /* finished traversing face */
  }

  if (is_in_face && state->node->opcode == VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_vertex_list_get_count(state->node);
    ptr = prf_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i++) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                      ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }
  else if (is_in_face && state->node->opcode == MORPH_VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_morph_vertex_list_get_count(state->node) * 2;
    ptr = prf_morph_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i += 2) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                       ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray,my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }

  else if (is_in_face && prf_vertex_lookup(state->node, &vertex)) {
    array_append_float(vertexarray, vertex.x);
    array_append_float(vertexarray, vertex.y);
    array_append_float(vertexarray, vertex.z);

    array_append_float(texcoordarray, 0.0f);
    array_append_float(texcoordarray, 0.0f);
    if (color_per_vertex) {
      if (vertex.flags & 0x2000) {
        array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
      }
      else if (vertex.flags & 0x1000) {
        array_append_int(colorarray, vertex.packed_color);
      }
      else {
        array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
      }
    }
  }

  else if (is_in_face && state->node->opcode == POP_OPCODE) {
    float *mat;
    is_in_face = 0;

    mat = (float*) prf_state_get_matrix(state);

    if (array_count(vertexarray) == 1*3) {
      /* points not supported yet */
    }
    else if (array_count(vertexarray) == 2*3) {
#define idx ((faceset*)facesets[current_index])->lineIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx

      get_coords_3d(vertexarray, 0, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      get_coords_3d(vertexarray, 1, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      array_append_int(idx, -1);

      if (color_per_vertex) {
        packed_to_vec(colorarray[0], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        packed_to_vec(colorarray[1], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        array_append_int(colidx, -1);
      }
#undef idx
#undef bsp
#undef colbsp
#undef colidx
    }
    else if (array_count(vertexarray) >= 3*3) {

      int dotex = ((faceset*)facesets[current_index])->texture_pattern_index >= 0;

      if (color_per_vertex) {
        assert(array_count(colorarray) == array_count(vertexarray)/3);
      }
      if (dotex) {
        /*
        assert(array_count(texcoordarray) == array_count(vertexarray));
        */
      }
#define idx ((faceset*)facesets[current_index])->indices
#define tidx ((faceset*)facesets[current_index])->texIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx
#define texcoords ((faceset*)facesets[current_index])->texcoords

      n = array_count(vertexarray) / 3;
      for (i = 0; i < n; i++) {
        get_coords_3d(vertexarray, i ,tmp);
        mult_matrix_vec(mat, tmp);
        array_append_int(idx, bsp_add_point(bsp, tmp));
        if (dotex) {
          get_coords_2d(texcoordarray, i, tmp);
          array_append_int(tidx, bsp_add_point(texcoords, tmp));

        }
        if (color_per_vertex) {
          packed_to_vec(colorarray[i], tmp);
          array_append_int(colidx, bsp_add_point(colbsp, tmp));
        }
      }
      array_append_int(idx, -1);
      if (dotex) array_append_int(tidx, -1);
      if (color_per_vertex) array_append_int(colidx, -1);
    }
#undef idx
#undef tidx
#undef bsp
#undef colbsp
#undef colidx
#undef texcoords
  }
  return PRF_TRAV_CONTINUE;
}